

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_api.cpp
# Opt level: O2

void __thiscall cppcms::impl::cgi::http::async_read_some_headers(http *this,handler *h)

{
  pointer pcVar1;
  pointer pcVar2;
  callback *pcVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<cppcms::impl::cgi::http> ptr;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> local_60;
  intrusive_ptr<booster::callable<void_()>_> local_58;
  undefined1 local_50 [16];
  anon_class_24_2_de3467ba_for_func local_40;
  
  pcVar1 = (this->input_body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar2 = (this->input_body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pcVar1 == pcVar2) || ((long)pcVar1 - (long)pcVar2 == (ulong)this->input_body_ptr_)) {
    self((http *)&stack0xffffffffffffffd8);
    mfunc_to_event_handler<cppcms::impl::cgi::http,std::shared_ptr<cppcms::impl::cgi::http>,booster::callback<void(std::error_code_const&)>const&,booster::callback<void(std::error_code_const&)>>
              ((offset_in_http_to_subr)&local_60,(shared_ptr<cppcms::impl::cgi::http> *)0xe1,
               (callback<void_(const_std::error_code_&)> *)0x0);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::intrusive_ptr
              ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)local_50,
               &local_60);
    booster::aio::basic_io_device::on_readable((callback *)&this->socket_);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)local_50);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              (&local_60);
    this_00 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0;
  }
  else {
    self((http *)local_50);
    pcVar3 = (callback *)booster::aio::basic_io_device::get_io_service();
    std::__shared_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2> *)
               (local_50 + 0x10),
               (__shared_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2> *)local_50);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::intrusive_ptr
              (&local_40.h.call_ptr,&h->call_ptr);
    booster::callback<void()>::
    callback<cppcms::impl::cgi::http::async_read_some_headers(booster::callback<void(std::error_code_const&)>const&)::_lambda()_1_>
              ((callback<void()> *)&local_58,(anon_class_24_2_de3467ba_for_func *)(local_50 + 0x10))
    ;
    booster::aio::io_service::post(pcVar3);
    booster::intrusive_ptr<booster::callable<void_()>_>::~intrusive_ptr(&local_58);
    async_read_some_headers(booster::callback<void(std::error_code_const&)>const&)::{lambda()#1}::
    ~callback((_lambda___1_ *)(local_50 + 0x10));
    this_00 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
  update_time(this);
  return;
}

Assistant:

void async_read_some_headers(handler const &h)
		{
			if(!input_buffer_empty()) {
				auto ptr = self();
				socket_.get_io_service().post([=] {
					ptr->some_headers_data_read(booster::system::error_code(),h);
				});
			}
			else {
				socket_.on_readable(mfunc_to_event_handler(&http::some_headers_data_read,self(),h));
			}
			update_time();
		}